

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O1

int vpx_rac_get_uint(VpxRangeCoder *c,int bits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  if (bits == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      uVar2 = vpx_rac_renorm(c);
      iVar3 = (c->high * 0x80 + -0x80 >> 8) + 1;
      uVar4 = iVar3 * 0x10000;
      bVar6 = uVar4 <= uVar2;
      iVar1 = c->high - iVar3;
      if (!bVar6) {
        uVar4 = 0;
        iVar1 = iVar3;
      }
      c->high = iVar1;
      c->code_word = uVar2 - uVar4;
      iVar5 = (uint)bVar6 + iVar5 * 2;
      bits = bits + -1;
    } while (bits != 0);
  }
  return iVar5;
}

Assistant:

int vpx_rac_get_uint(VpxRangeCoder *c, int bits)
{
    int value = 0;

    while (bits--) {
        value = (value << 1) | vpx_rac_get(c);
    }

    return value;
}